

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::BareToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  char *pcVar1;
  Location loc;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  undefined4 uStack_c;
  
  uVar2 = (this->filename_)._M_dataplus;
  uVar3 = (this->filename_)._M_string_length;
  loc.filename.size_ = uVar3;
  loc.filename.data_ = (char *)uVar2;
  pcVar1 = this->line_start_;
  auVar6._8_4_ = (int)pcVar1;
  auVar6._0_8_ = pcVar1;
  auVar6._12_4_ = (int)((ulong)pcVar1 >> 0x20);
  uVar4 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
  uVar5 = (int)((long)this->cursor_ - auVar6._8_8_) + 1;
  uVar7 = -(uint)(1 < (int)uVar4);
  uVar8 = -(uint)(1 < (int)uVar5);
  loc.field_1.field_0.first_column = ~uVar7 & 1 | uVar4 & uVar7;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_c;
  loc.field_1.field_0.last_column = ~uVar8 & 1 | uVar5 & uVar8;
  Token::Token(__return_storage_ptr__,loc,token_type);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::BareToken(TokenType token_type) {
  return Token(GetLocation(), token_type);
}